

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_move_semantics.cpp
# Opt level: O0

void __thiscall L18_1::Useless::Useless(Useless *this,int k,char ch)

{
  ostream *this_00;
  void *this_01;
  char *pcVar1;
  ulong uVar2;
  int local_1c;
  int i;
  char ch_local;
  int k_local;
  Useless *this_local;
  
  this->n = k;
  count = count + 1;
  this_00 = std::operator<<((ostream *)&std::cout,
                            "int and char constructor called, number of instance: ");
  this_01 = (void *)std::ostream::operator<<(this_00,count);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  uVar2 = (ulong)this->n;
  if ((long)uVar2 < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pcVar1 = (char *)operator_new__(uVar2);
  this->pc = pcVar1;
  for (local_1c = 0; local_1c < this->n; local_1c = local_1c + 1) {
    this->pc[local_1c] = ch;
  }
  showObject(this);
  return;
}

Assistant:

Useless::Useless(int k, char ch): n(k) {
        count++;
        cout << "int and char constructor called, number of instance: " << count << endl;

        //  allocate array of char, and fill with ch
        pc = new char[n];
        for(int i = 0; i < n; i++) {
            pc[i] = ch;
        }
        showObject();
    }